

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_ini_file.cxx
# Opt level: O2

void __thiscall xray_re::xr_ini_file::ini_section::~ini_section(ini_section *this)

{
  delete_elements<std::vector<xray_re::xr_ini_file::ini_item*,std::allocator<xray_re::xr_ini_file::ini_item*>>>
            (&this->items);
  std::
  _Vector_base<xray_re::xr_ini_file::ini_item_*,_std::allocator<xray_re::xr_ini_file::ini_item_*>_>
  ::~_Vector_base(&(this->items).
                   super__Vector_base<xray_re::xr_ini_file::ini_item_*,_std::allocator<xray_re::xr_ini_file::ini_item_*>_>
                 );
  std::__cxx11::string::~string((string *)this);
  return;
}

Assistant:

xr_ini_file::ini_section::~ini_section()
{
	delete_elements(items);
}